

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

void __thiscall
eggs::variants::detail::
_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_true>
::_storage(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_true>
           *this,_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_true>
                 *rhs)

{
  ulong uVar1;
  
  (this->
  super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_true,_true>
  )._which = 0;
  uVar1 = (rhs->
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_true,_true>
          )._which;
  if (uVar1 < 9) {
    (*visitor<eggs::variants::detail::move_construct,_void_(void_*,_void_*)>::
      _table<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
      ::value[uVar1])(this,rhs);
    (this->
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_true,_true>
    )._which = (rhs->
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_true,_true>
               )._which;
    return;
  }
  __assert_fail("index < size && \"discriminator out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/variant/include/eggs/variant/detail/visitor.hpp"
                ,0x36,
                "static int eggs::variants::detail::visitor<eggs::variants::detail::move_construct, void (void *, void *)>::_assert_in_range_failure(std::size_t, std::size_t) [F = eggs::variants::detail::move_construct, Sig = void (void *, void *)]"
               );
}

Assistant:

EGGS_CXX11_CONSTEXPR _storage() EGGS_CXX11_NOEXCEPT
          : base_type{index<0>{}}
          , _which{0}
        {}